

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void * bc_malloc(size_t size)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t in_RSI;
  size_t sVar5;
  
  pvVar2 = malloc(size);
  if (pvVar2 != (void *)0x0) {
    return pvVar2;
  }
  bc_malloc_cold_1();
  sVar5 = in_RSI;
  pvVar2 = realloc((void *)size,in_RSI);
  if (in_RSI != 0 && pvVar2 == (void *)0x0) {
    bc_realloc_cold_1();
    puVar3 = (undefined8 *)bc_malloc(0x10);
    puVar3[1] = sVar5;
    *puVar3 = 0;
    puVar1 = (undefined8 *)size;
    if ((undefined8 *)size != (undefined8 *)0x0) {
      do {
        puVar4 = puVar1;
        puVar1 = (undefined8 *)*puVar4;
      } while (puVar1 != (undefined8 *)0x0);
      *puVar4 = puVar3;
      puVar3 = (undefined8 *)size;
    }
    return puVar3;
  }
  return pvVar2;
}

Assistant:

void*
bc_malloc(size_t size)
{
    // simple things simple!
    void *rv = malloc(size);
    if (rv == NULL) {
        fprintf(stderr, "fatal: Failed to allocate memory!\n");
        abort();
    }
    return rv;
}